

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O3

void * FilterRender::doSlice
                 (void *data,uint width,uint height,
                 vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong local_80;
  Point local_58;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_48;
  
  uVar9 = (ulong)height;
  pvVar2 = operator_new__(uVar9 * 8);
  if (height != 0) {
    uVar7 = (ulong)width;
    uVar10 = 0;
    do {
      pvVar3 = operator_new__(uVar7 * 8);
      *(void **)((long)pvVar2 + uVar10 * 8) = pvVar3;
      if (width != 0) {
        uVar8 = 0;
        do {
          pvVar4 = operator_new__(4);
          *(void **)((long)pvVar3 + uVar8 * 8) = pvVar4;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
    if (height != 0) {
      uVar10 = 0;
      pvVar3 = data;
      do {
        if (width != 0) {
          lVar5 = *(long *)((long)pvVar2 + uVar10 * 8);
          uVar8 = 0;
          do {
            lVar6 = 0;
            do {
              *(undefined1 *)(*(long *)(lVar5 + uVar8 * 8) + lVar6) =
                   *(undefined1 *)((long)pvVar3 + lVar6);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            pvVar3 = (void *)((long)pvVar3 + 4);
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar7);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
      if (height != 0) {
        local_80 = 0;
        do {
          if (width != 0) {
            uVar10 = 0;
            do {
              Geometry::Point::Point(&local_58,(double)(int)local_80,(double)(int)uVar10);
              std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector(&local_48,poly)
              ;
              bVar1 = Geometry::InPoly(&local_58,&local_48);
              std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_48);
              Geometry::Point::~Point(&local_58);
              if (!bVar1) {
                lVar5 = *(long *)((long)pvVar2 + local_80 * 8);
                lVar6 = 0;
                do {
                  *(undefined1 *)(*(long *)(lVar5 + uVar10 * 8) + lVar6) = 0;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 4);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar7);
          }
          local_80 = local_80 + 1;
        } while (local_80 != uVar9);
        if (height != 0) {
          uVar10 = 0;
          do {
            if (width != 0) {
              uVar8 = 0;
              do {
                lVar5 = 0;
                do {
                  *(undefined1 *)((long)data + lVar5) =
                       *(undefined1 *)
                        (*(long *)(*(long *)((long)pvVar2 + uVar10 * 8) + uVar8 * 8) + lVar5);
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 4);
                data = (void *)((long)data + 4);
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar7);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar9);
          if (height != 0) {
            uVar10 = 0;
            do {
              pvVar3 = *(void **)((long)pvVar2 + uVar10 * 8);
              if (width != 0) {
                uVar9 = 0;
                do {
                  pvVar2 = *(void **)((long)pvVar3 + uVar9 * 8);
                  if (pvVar2 != (void *)0x0) {
                    operator_delete__(pvVar2);
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
LAB_00105b08:
                operator_delete__(pvVar3);
              }
              if (pvVar3 != (void *)0x0) goto LAB_00105b08;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar9);
          }
        }
      }
    }
  }
  operator_delete__(pvVar2);
}

Assistant:

void* FilterRender::doSlice(void *data, uint width, uint height, std::vector<Point> poly) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			if (!InPoly(Point(i, j), poly)) {
				for (int k = 0; k < 4; k++) {
					map[i][j][k] = 0;
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}